

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall FBehavior::SetArrayVal(FBehavior *this,int arraynum,int index,int value)

{
  ArrayInfo *array;
  int value_local;
  int index_local;
  int arraynum_local;
  FBehavior *this_local;
  
  if (((uint)arraynum < (uint)this->NumTotalArrays) &&
     ((uint)index < this->Arrays[arraynum]->ArraySize)) {
    this->Arrays[arraynum]->Elements[index] = value;
  }
  return;
}

Assistant:

void FBehavior::SetArrayVal (int arraynum, int index, int value)
{
	if ((unsigned)arraynum >= (unsigned)NumTotalArrays)
		return;
	const ArrayInfo *array = Arrays[arraynum];
	if ((unsigned)index >= (unsigned)array->ArraySize)
		return;
	array->Elements[index] = value;
}